

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O3

SQInteger sqstd_rex_list(SQRex *exp)

{
  SQInteger SVar1;
  SQInteger SVar2;
  
  if (*exp->_p == '^') {
    exp->_p = exp->_p + 1;
    SVar1 = sqstd_rex_newnode(exp,0x10b);
    SVar2 = sqstd_rex_element(exp);
    if (SVar1 != -1) {
      exp->_nodes[SVar1].next = SVar2;
      SVar2 = SVar1;
    }
  }
  else {
    SVar2 = sqstd_rex_element(exp);
  }
  SVar1 = SVar2;
  if (*exp->_p == '|') {
    exp->_p = exp->_p + 1;
    SVar1 = sqstd_rex_newnode(exp,0x101);
    exp->_nodes[SVar1].left = SVar2;
    SVar2 = sqstd_rex_list(exp);
    exp->_nodes[SVar1].right = SVar2;
  }
  return SVar1;
}

Assistant:

static SQInteger sqstd_rex_list(SQRex *exp)
{
    SQInteger ret=-1,e;
    if(*exp->_p == SQREX_SYMBOL_BEGINNING_OF_STRING) {
        exp->_p++;
        ret = sqstd_rex_newnode(exp,OP_BOL);
    }
    e = sqstd_rex_element(exp);
    if(ret != -1) {
        exp->_nodes[ret].next = e;
    }
    else ret = e;

    if(*exp->_p == SQREX_SYMBOL_BRANCH) {
        SQInteger temp,tright;
        exp->_p++;
        temp = sqstd_rex_newnode(exp,OP_OR);
        exp->_nodes[temp].left = ret;
        tright = sqstd_rex_list(exp);
        exp->_nodes[temp].right = tright;
        ret = temp;
    }
    return ret;
}